

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelwithmem.h
# Opt level: O0

void __thiscall
TPZCompElWithMem<TPZMultiphysicsCompEl<pzgeom::TPZGeoCube>_>::TPZCompElWithMem
          (TPZCompElWithMem<TPZMultiphysicsCompEl<pzgeom::TPZGeoCube>_> *this)

{
  TPZRegisterClassId *in_RDI;
  TPZMultiphysicsCompEl<pzgeom::TPZGeoCube> *unaff_retaddr;
  TPZStack<long,_128> *in_stack_ffffffffffffffe0;
  TPZRegisterClassId *vtt;
  
  vtt = in_RDI;
  TPZRegisterClassId::
  TPZRegisterClassId<TPZCompElWithMem<TPZMultiphysicsCompEl<pzgeom::TPZGeoCube>>>(in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_024f9958);
  TPZMultiphysicsCompEl<pzgeom::TPZGeoCube>::TPZMultiphysicsCompEl(unaff_retaddr,(void **)vtt);
  *(undefined ***)in_RDI = &PTR__TPZCompElWithMem_024f9610;
  *(undefined ***)in_RDI = &PTR__TPZCompElWithMem_024f9610;
  TPZStack<long,_128>::TPZStack(in_stack_ffffffffffffffe0);
  return;
}

Assistant:

TPZCompElWithMem<TBASE>::TPZCompElWithMem() : TPZRegisterClassId(&TPZCompElWithMem::ClassId),
TBASE() {
    //PrepareIntPtIndices();
}